

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Sector_SetGravity
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  int iVar2;
  FSectorTagIterator itr;
  FSectorTagIterator local_28;
  double local_20;
  
  iVar2 = 99;
  if (arg2 < 99) {
    iVar2 = arg2;
  }
  if (arg0 == 0) {
    local_28.start = 0;
  }
  else {
    local_28.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_28.searchtag = arg0;
  uVar1 = FSectorTagIterator::Next(&local_28);
  if (-1 < (int)uVar1) {
    local_20 = (double)iVar2 * 0.01 + (double)arg1;
    do {
      sectors[uVar1].gravity = local_20;
      uVar1 = FSectorTagIterator::Next(&local_28);
    } while (-1 < (int)uVar1);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetGravity)
// Sector_SetGravity (tag, intpart, fracpart)
{
	double gravity;

	if (arg2 > 99)
		arg2 = 99;
	gravity = (double)arg1 + (double)arg2 * 0.01;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
		sectors[secnum].gravity = gravity;

	return true;
}